

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigMiter.c
# Opt level: O3

Sec_MtrStatus_t * Sec_MiterStatus(Sec_MtrStatus_t *__return_storage_ptr__,Aig_Man_t *p)

{
  int iVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  
  __return_storage_ptr__->nUndec = 0;
  __return_storage_ptr__->nUnsat = 0;
  __return_storage_ptr__->nSat = 0;
  iVar1 = p->nTruePis;
  __return_storage_ptr__->nInputs = iVar1;
  __return_storage_ptr__->nNodes = p->nObjs[6] + p->nObjs[5];
  iVar2 = p->nTruePos;
  __return_storage_ptr__->nOutputs = iVar2;
  if ((long)iVar2 < 1) {
    iVar4 = -1;
  }
  else {
    uVar11 = p->vCos->nSize;
    uVar9 = 0;
    uVar8 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar8 = uVar9;
    }
    uVar5 = 0xffffffff;
    iVar10 = 0;
    iVar6 = 0;
    iVar7 = 0;
    do {
      if (uVar8 == uVar9) {
        __return_storage_ptr__->nSat = iVar7;
        __return_storage_ptr__->nUndec = iVar6;
        __return_storage_ptr__->nUnsat = iVar10;
        __return_storage_ptr__->iOut = (int)uVar5;
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pAVar3 = *(Aig_Obj_t **)((long)p->vCos->pArray[uVar9] + 8);
      if (pAVar3 == (Aig_Obj_t *)((ulong)p->pConst1 ^ 1)) {
        iVar10 = iVar10 + 1;
      }
      else {
        if (pAVar3 != p->pConst1) {
          uVar11 = (uint)*(undefined8 *)((int *)((ulong)pAVar3 & 0xfffffffffffffffe) + 6);
          if ((((uVar11 & 7) != 2) || (iVar1 <= *(int *)((ulong)pAVar3 & 0xfffffffffffffffe))) &&
             ((((uint)pAVar3 ^ uVar11 >> 3) & 1) == 0)) {
            iVar6 = iVar6 + 1;
            goto LAB_006312d8;
          }
        }
        iVar7 = iVar7 + 1;
        if ((int)uVar5 == -1) {
          uVar5 = uVar9 & 0xffffffff;
        }
      }
LAB_006312d8:
      iVar4 = (int)uVar5;
      uVar9 = uVar9 + 1;
    } while ((long)iVar2 != uVar9);
    __return_storage_ptr__->nSat = iVar7;
    __return_storage_ptr__->nUndec = iVar6;
    __return_storage_ptr__->nUnsat = iVar10;
  }
  __return_storage_ptr__->iOut = iVar4;
  return __return_storage_ptr__;
}

Assistant:

ABC_NAMESPACE_IMPL_START

 
////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Checks the status of the miter.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
Sec_MtrStatus_t Sec_MiterStatus( Aig_Man_t * p )
{
    Sec_MtrStatus_t Status;
    Aig_Obj_t * pObj, * pChild;
    int i;
    memset( &Status, 0, sizeof(Sec_MtrStatus_t) );
    Status.iOut = -1;
    Status.nInputs  = Saig_ManPiNum( p );
    Status.nNodes   = Aig_ManNodeNum( p );
    Status.nOutputs = Saig_ManPoNum(p);
    Saig_ManForEachPo( p, pObj, i )
    {
        pChild = Aig_ObjChild0(pObj);
        // check if the output is constant 0
        if ( pChild == Aig_ManConst0(p) )
            Status.nUnsat++;
        // check if the output is constant 1
        else if ( pChild == Aig_ManConst1(p) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
        // check if the output is a primary input
        else if ( Saig_ObjIsPi(p, Aig_Regular(pChild)) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
    // check if the output is 1 for the 0000 pattern
        else if ( Aig_Regular(pChild)->fPhase != (unsigned)Aig_IsComplement(pChild) )
        {
            Status.nSat++;
            if ( Status.iOut == -1 )
                Status.iOut = i;
        }
        else
            Status.nUndec++;
    }
    return Status;
}